

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O3

int fits_write_keys_histoe
              (fitsfile *fptr,fitsfile *histptr,int naxis,int *colnum,char (*colname) [71],
              char **colexpr,int *status)

{
  int *piVar1;
  int iVar2;
  char (*value) [71];
  ulong uVar3;
  ulong uVar4;
  char svalue [71];
  char keyname [75];
  int local_11c;
  fitsfile *local_118;
  ulong local_110;
  undefined8 local_108;
  char (*local_100) [71];
  fitsfile *local_f8;
  char **local_f0;
  int *local_e8;
  ulong local_e0;
  undefined1 local_d8 [80];
  char local_88 [88];
  
  iVar2 = *status;
  if (0 < naxis && iVar2 < 1) {
    local_e0 = (ulong)(uint)naxis;
    uVar4 = 0;
    local_118 = histptr;
    local_100 = colname;
    local_f8 = fptr;
    local_f0 = colexpr;
    local_e8 = colnum;
    do {
      local_11c = 0;
      if ((((local_f0 == (char **)0x0) || (local_f0[uVar4] == (char *)0x0)) ||
          (local_100 == (char (*) [71])0x0)) || (*local_f0[uVar4] == '\0')) {
        uVar3 = uVar4 + 1;
        iVar2 = (int)uVar3;
        ffkeyn("CTYPE",iVar2,local_88,&local_11c);
        ffgky(histptr,0x10,local_88,local_d8,(char *)0x0,&local_11c);
        piVar1 = local_e8;
        if (local_11c != 0) {
          local_11c = 0;
          ffkeyn("TTYPE",local_e8[uVar4],local_88,&local_11c);
          ffgky(local_f8,0x10,local_88,local_d8,(char *)0x0,&local_11c);
          if (local_11c == 0) {
            ffkeyn("CTYPE",iVar2,local_88,&local_11c);
            ffpky(local_118,0x10,local_88,local_d8,"Coordinate Type",&local_11c);
          }
          local_11c = 0;
          ffkeyn("TUNIT",piVar1[uVar4],local_88,&local_11c);
          ffgky(local_f8,0x10,local_88,local_d8,(char *)0x0,&local_11c);
          histptr = local_118;
          uVar4 = uVar3;
          if (local_11c == 0) {
            ffkeyn("CUNIT",iVar2,local_88,&local_11c);
            histptr = local_118;
            ffpky(local_118,0x10,local_88,local_d8,"Coordinate Units",&local_11c);
          }
          goto LAB_001c127c;
        }
      }
      else {
        value = local_100 + uVar4;
        uVar4 = uVar4 + 1;
        local_110 = uVar4;
        ffkeyn("CTYPE",(int)uVar4,local_88,&local_11c);
        ffpky(histptr,0x10,local_88,value,"Coordinate Type",&local_11c);
        uVar3 = uVar4 & 0xffffffff;
        uVar4 = local_110;
LAB_001c127c:
        local_110 = uVar4;
        local_108 = 0x3ff0000000000000;
        local_11c = 0;
        iVar2 = (int)uVar3;
        ffkeyn("CRPIX",iVar2,local_88,&local_11c);
        ffpky(histptr,0x52,local_88,&local_108,"Reference Pixel",&local_11c);
        local_108 = 0x3ff0000000000000;
        local_11c = 0;
        ffkeyn("CRVAL",iVar2,local_88,&local_11c);
        ffpky(histptr,0x52,local_88,&local_108,"Reference Value",&local_11c);
        local_11c = 0;
        local_108 = 0x3ff0000000000000;
        ffkeyn("CDELT",iVar2,local_88,&local_11c);
        ffpky(histptr,0x52,local_88,&local_108,"Pixel size",&local_11c);
        uVar3 = local_110;
      }
      uVar4 = uVar3;
    } while (uVar3 != local_e0);
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int fits_write_keys_histoe(
      fitsfile *fptr,   /* I - pointer to table to be binned              */
      fitsfile *histptr,  /* I - pointer to output histogram image HDU      */
      int naxis,        /* I - number of axes in the histogram image      */
      int *colnum,      /* I - column numbers (array length = naxis)      */
      char colname[4][FLEN_VALUE], /* I - if expression, then column name to use */
      char *colexpr[4], /* I - if expression, then column name to use */
      int *status)     
{      
   /*  Write default WCS keywords in the output histogram image header */
   /*  if the keywords do not already exist.   */

    int ii, tstatus;
    char keyname[FLEN_KEYWORD], svalue[FLEN_VALUE];
    double dvalue;
    
    if (*status > 0)
        return(*status);

    for (ii = 0; ii < naxis; ii++)
    {
       /*  CTYPEn  */
       tstatus = 0;

       if (colexpr && colexpr[ii] && colexpr[ii][0] && colname[ii]) 
       {
	 /* Column expression: we need to put the column name from the binning expression */
         ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
         ffpky(histptr, TSTRING, keyname, colname[ii], "Coordinate Type", &tstatus);
       }
       else
       {
	 /* Column name */
	 tstatus = 0;
	 ffkeyn("CTYPE", ii+1, keyname, &tstatus);
	 ffgky(histptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus) continue;  /* keyword already exists, so skip to next axis */

	 /* use column name as the axis name */
	 tstatus = 0;
	 ffkeyn("TTYPE", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Type", &tstatus);
	   }
	 
	 /*  CUNITn,  use the column units */
	 tstatus = 0;
	 ffkeyn("TUNIT", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CUNIT", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Units", &tstatus);
	   }
       }

       /*  CRPIXn  - Reference Pixel choose first pixel in new image as ref. pix. */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Pixel", &tstatus);

       /*  CRVALn - Value at the location of the reference pixel */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Value", &tstatus);

       /*  CDELTn - unit size of pixels  */
       dvalue = 1.0;  
       tstatus = 0;
       dvalue = 1.;
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Pixel size", &tstatus);

    }
    return(*status);
}